

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::BindingImagesTest::verifyAdditionalResults(BindingImagesTest *this)

{
  bool bVar1;
  bool local_22;
  bool local_21;
  BindingImagesTest *this_local;
  
  if (this->m_test_case == TEX_BUFFER) {
    bVar1 = BindingImageTest::verifyBuffer(&this->super_BindingImageTest,&this->m_goku_buffer);
    local_22 = false;
    if (bVar1) {
      bVar1 = BindingImageTest::verifyBuffer(&this->super_BindingImageTest,&this->m_vegeta_buffer);
      local_22 = false;
      if (bVar1) {
        local_22 = BindingImageTest::verifyBuffer
                             (&this->super_BindingImageTest,&this->m_trunks_buffer);
      }
    }
    this_local._7_1_ = local_22;
  }
  else {
    bVar1 = BindingImageTest::verifyTexture(&this->super_BindingImageTest,&this->m_goku_texture);
    local_21 = false;
    if (bVar1) {
      bVar1 = BindingImageTest::verifyTexture(&this->super_BindingImageTest,&this->m_vegeta_texture)
      ;
      local_21 = false;
      if (bVar1) {
        local_21 = BindingImageTest::verifyTexture
                             (&this->super_BindingImageTest,&this->m_trunks_texture);
      }
    }
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool BindingImagesTest::verifyAdditionalResults() const
{
	if (Utils::TEX_BUFFER != m_test_case)
	{
		return (verifyTexture(m_goku_texture) && verifyTexture(m_vegeta_texture) && verifyTexture(m_trunks_texture));
	}
	else
	{
		return (verifyBuffer(m_goku_buffer) && verifyBuffer(m_vegeta_buffer) && verifyBuffer(m_trunks_buffer));
	}
}